

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void load_history(void)

{
  char *key;
  Name local_18;
  int local_10;
  uint local_c;
  int max_files;
  int i;
  
  Fl_Preferences::get(&fluid_prefs,"recent_files",&local_10,5);
  if (10 < local_10) {
    local_10 = 10;
  }
  for (local_c = 0; (int)local_c < local_10; local_c = local_c + 1) {
    Fl_Preferences::Name::Name(&local_18,"file%d",(ulong)local_c);
    key = Fl_Preferences::Name::operator_cast_to_char_(&local_18);
    Fl_Preferences::get(&fluid_prefs,key,absolute_history[(int)local_c],"",0x800);
    Fl_Preferences::Name::~Name(&local_18);
    if (absolute_history[(int)local_c][0] == '\0') break;
    fl_filename_relative(relative_history[(int)local_c],0x800,absolute_history[(int)local_c]);
    if (local_c == 9) {
      history_item[9].flags = 0x80;
    }
    else {
      history_item[(int)local_c].flags = 0;
    }
  }
  for (; (int)local_c < 10; local_c = local_c + 1) {
    if (local_c != 0) {
      history_item[(int)(local_c - 1)].flags = history_item[(int)(local_c - 1)].flags | 0x80;
    }
    Fl_Menu_Item::hide(history_item + (int)local_c);
  }
  return;
}

Assistant:

void load_history() {
  int	i;		// Looping var
  int	max_files;


  fluid_prefs.get("recent_files", max_files, 5);
  if (max_files > 10) max_files = 10;

  for (i = 0; i < max_files; i ++) {
    fluid_prefs.get( Fl_Preferences::Name("file%d", i), absolute_history[i], "", sizeof(absolute_history[i]));
    if (absolute_history[i][0]) {
      // Make a relative version of the filename for the menu...
      fl_filename_relative(relative_history[i], sizeof(relative_history[i]),
                           absolute_history[i]);

      if (i == 9) history_item[i].flags = FL_MENU_DIVIDER;
      else history_item[i].flags = 0;
    } else break;
  }

  for (; i < 10; i ++) {
    if (i) history_item[i-1].flags |= FL_MENU_DIVIDER;
    history_item[i].hide();
  }
}